

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O1

BoardSize __thiscall Panel::checkBoardSize(Panel *this)

{
  char cVar1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var2 = (this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var2 != &(this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header &&
         (cVar1 = QAbstractButton::isChecked(), cVar1 == '\0'))) {
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  return p_Var2[1]._M_color;
}

Assistant:

BoardSize Panel::checkBoardSize()
{
    const auto it = std::find_if( radioSizeMap.begin(), radioSizeMap.end(), [] ( const auto& it ) { return it.second.isChecked(); });
    return it->first;
}